

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersector1<8,_1,_true,_embree::avx2::ArrayIntersector1<embree::avx2::TriangleMvIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  Geometry *pGVar5;
  RTCIntersectArguments *pRVar6;
  RTCRayQueryContext *pRVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  int iVar17;
  RayHit *pRVar18;
  ulong uVar19;
  long lVar20;
  undefined1 (*pauVar21) [16];
  ulong uVar22;
  long lVar23;
  undefined1 (*pauVar24) [16];
  Scene *pSVar25;
  ulong uVar26;
  ulong uVar27;
  undefined1 (*pauVar28) [16];
  RayHit *pRVar29;
  RayHit *pRVar30;
  undefined4 uVar31;
  ulong unaff_R14;
  ulong uVar32;
  ulong uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined8 uVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [64];
  float fVar85;
  float fVar93;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar91;
  float fVar92;
  undefined1 auVar90 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  float fVar97;
  float fVar98;
  float fVar99;
  undefined1 auVar96 [16];
  float fVar100;
  float fVar101;
  float fVar102;
  undefined1 auVar103 [64];
  undefined1 auVar104 [16];
  undefined1 auVar105 [64];
  undefined1 auVar106 [16];
  undefined1 auVar107 [64];
  float fVar108;
  float fVar110;
  float fVar111;
  float fVar112;
  undefined1 auVar109 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_27b9;
  ulong local_27b8;
  ulong local_27b0;
  RayHit *local_27a8;
  RayQueryContext *local_27a0;
  undefined1 local_2794 [4];
  undefined1 local_2790 [16];
  undefined1 local_2780 [16];
  undefined8 local_2770;
  float fStack_2768;
  float fStack_2764;
  undefined1 local_2760 [16];
  undefined1 local_2750 [16];
  RTCFilterFunctionNArguments local_2738;
  ulong local_2708;
  undefined1 (*local_2700) [16];
  ulong local_26f8;
  RayHit *local_26f0;
  ulong local_26e8;
  ulong local_26e0;
  ulong local_26d8;
  float local_26d0;
  undefined4 local_26cc;
  undefined4 local_26c8;
  undefined4 local_26c4;
  undefined4 local_26c0;
  undefined4 local_26bc;
  uint local_26b8;
  uint local_26b4;
  uint local_26b0;
  undefined8 local_26a0;
  undefined8 uStack_2698;
  undefined1 local_2690 [16];
  undefined1 local_2680 [32];
  undefined1 local_2660 [16];
  undefined1 *local_2650;
  undefined1 local_2640 [16];
  undefined1 local_2630 [16];
  undefined1 local_2620 [16];
  undefined1 local_2610 [16];
  undefined1 local_2600 [16];
  undefined1 local_25f0 [16];
  undefined1 local_25e0 [2] [16];
  undefined1 local_25c0 [32];
  undefined1 local_2590 [16];
  undefined1 local_2580 [16];
  undefined1 local_2570 [16];
  undefined1 local_2560 [16];
  undefined1 local_2550 [16];
  undefined1 local_2540 [16];
  undefined1 local_2530 [16];
  undefined1 local_2520 [16];
  undefined1 local_2510 [16];
  undefined1 local_2500 [16];
  undefined1 local_24f0 [16];
  undefined1 local_24e0 [16];
  undefined1 local_24d0 [16];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  float local_2480;
  float fStack_247c;
  float fStack_2478;
  float fStack_2474;
  float fStack_2470;
  float fStack_246c;
  float fStack_2468;
  float fStack_2464;
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  float local_2420;
  float fStack_241c;
  float fStack_2418;
  float fStack_2414;
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  float fStack_2404;
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_2398 = 0;
    if (local_23a0 != 8) {
      aVar1 = (ray->super_RayK<1>).dir.field_0;
      auVar83 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar54 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      local_2690._8_4_ = 0x7fffffff;
      local_2690._0_8_ = 0x7fffffff7fffffff;
      local_2690._12_4_ = 0x7fffffff;
      auVar82 = vandps_avx((undefined1  [16])aVar1,local_2690);
      auVar67._8_4_ = 0x219392ef;
      auVar67._0_8_ = 0x219392ef219392ef;
      auVar67._12_4_ = 0x219392ef;
      auVar82 = vcmpps_avx(auVar82,auVar67,1);
      auVar68._8_4_ = 0x3f800000;
      auVar68._0_8_ = &DAT_3f8000003f800000;
      auVar68._12_4_ = 0x3f800000;
      auVar67 = vdivps_avx(auVar68,(undefined1  [16])aVar1);
      auVar69._8_4_ = 0x5d5e0b6b;
      auVar69._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar69._12_4_ = 0x5d5e0b6b;
      auVar82 = vblendvps_avx(auVar67,auVar69,auVar82);
      local_2700 = (undefined1 (*) [16])local_2390;
      auVar59._0_4_ = auVar82._0_4_ * 0.99999964;
      auVar59._4_4_ = auVar82._4_4_ * 0.99999964;
      auVar59._8_4_ = auVar82._8_4_ * 0.99999964;
      auVar59._12_4_ = auVar82._12_4_ * 0.99999964;
      uVar31 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
      local_23c0._4_4_ = uVar31;
      local_23c0._0_4_ = uVar31;
      local_23c0._8_4_ = uVar31;
      local_23c0._12_4_ = uVar31;
      local_23c0._16_4_ = uVar31;
      local_23c0._20_4_ = uVar31;
      local_23c0._24_4_ = uVar31;
      local_23c0._28_4_ = uVar31;
      auVar90 = ZEXT3264(local_23c0);
      uVar31 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
      local_23e0._4_4_ = uVar31;
      local_23e0._0_4_ = uVar31;
      local_23e0._8_4_ = uVar31;
      local_23e0._12_4_ = uVar31;
      local_23e0._16_4_ = uVar31;
      local_23e0._20_4_ = uVar31;
      local_23e0._24_4_ = uVar31;
      local_23e0._28_4_ = uVar31;
      auVar94 = ZEXT3264(local_23e0);
      auVar53._0_4_ = auVar82._0_4_ * 1.0000004;
      auVar53._4_4_ = auVar82._4_4_ * 1.0000004;
      auVar53._8_4_ = auVar82._8_4_ * 1.0000004;
      auVar53._12_4_ = auVar82._12_4_ * 1.0000004;
      uVar31 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
      local_2400._4_4_ = uVar31;
      local_2400._0_4_ = uVar31;
      local_2400._8_4_ = uVar31;
      local_2400._12_4_ = uVar31;
      local_2400._16_4_ = uVar31;
      local_2400._20_4_ = uVar31;
      local_2400._24_4_ = uVar31;
      local_2400._28_4_ = uVar31;
      auVar95 = ZEXT3264(local_2400);
      auVar82 = vmovshdup_avx(auVar59);
      uVar52 = auVar82._0_8_;
      local_2440._8_8_ = uVar52;
      local_2440._0_8_ = uVar52;
      local_2440._16_8_ = uVar52;
      local_2440._24_8_ = uVar52;
      auVar103 = ZEXT3264(local_2440);
      auVar68 = vshufpd_avx(auVar59,auVar59,1);
      auVar67 = vshufps_avx(auVar59,auVar59,0xaa);
      uVar52 = auVar67._0_8_;
      local_2460._8_8_ = uVar52;
      local_2460._0_8_ = uVar52;
      local_2460._16_8_ = uVar52;
      local_2460._24_8_ = uVar52;
      auVar105 = ZEXT3264(local_2460);
      local_2708 = (ulong)(auVar59._0_4_ < 0.0) << 5;
      auVar67 = vmovshdup_avx(auVar53);
      uVar52 = auVar67._0_8_;
      local_24a0._8_8_ = uVar52;
      local_24a0._0_8_ = uVar52;
      local_24a0._16_8_ = uVar52;
      local_24a0._24_8_ = uVar52;
      auVar107 = ZEXT3264(local_24a0);
      auVar67 = vshufps_avx(auVar53,auVar53,0xaa);
      uVar52 = auVar67._0_8_;
      local_24c0._8_8_ = uVar52;
      local_24c0._0_8_ = uVar52;
      local_24c0._16_8_ = uVar52;
      local_24c0._24_8_ = uVar52;
      auVar109 = ZEXT3264(local_24c0);
      uVar26 = (ulong)(auVar82._0_4_ < 0.0) << 5 | 0x40;
      uVar27 = (ulong)(auVar68._0_4_ < 0.0) << 5 | 0x80;
      local_26d8 = local_2708 ^ 0x20;
      local_26e0 = uVar26 ^ 0x20;
      local_26e8 = uVar27 ^ 0x20;
      uVar31 = auVar83._0_4_;
      local_25c0._4_4_ = uVar31;
      local_25c0._0_4_ = uVar31;
      local_25c0._8_4_ = uVar31;
      local_25c0._12_4_ = uVar31;
      local_25c0._16_4_ = uVar31;
      local_25c0._20_4_ = uVar31;
      local_25c0._24_4_ = uVar31;
      local_25c0._28_4_ = uVar31;
      auVar84 = ZEXT3264(local_25c0);
      uVar31 = auVar54._0_4_;
      auVar40 = ZEXT3264(CONCAT428(uVar31,CONCAT424(uVar31,CONCAT420(uVar31,CONCAT416(uVar31,
                                                  CONCAT412(uVar31,CONCAT48(uVar31,CONCAT44(uVar31,
                                                  uVar31))))))));
      local_26a0 = mm_lookupmask_ps._240_8_;
      uStack_2698 = mm_lookupmask_ps._248_8_;
      local_2420 = auVar59._0_4_;
      fStack_241c = auVar59._0_4_;
      fStack_2418 = auVar59._0_4_;
      fStack_2414 = auVar59._0_4_;
      fStack_2410 = auVar59._0_4_;
      fStack_240c = auVar59._0_4_;
      fStack_2408 = auVar59._0_4_;
      fStack_2404 = auVar59._0_4_;
      local_2480 = auVar53._0_4_;
      fStack_247c = auVar53._0_4_;
      fStack_2478 = auVar53._0_4_;
      fStack_2474 = auVar53._0_4_;
      fStack_2470 = auVar53._0_4_;
      fStack_246c = auVar53._0_4_;
      fStack_2468 = auVar53._0_4_;
      fStack_2464 = auVar53._0_4_;
      uVar19 = local_2708;
      fVar97 = auVar59._0_4_;
      fVar98 = auVar59._0_4_;
      fVar99 = auVar59._0_4_;
      fVar100 = auVar59._0_4_;
      fVar101 = auVar59._0_4_;
      fVar102 = auVar59._0_4_;
      fVar85 = auVar53._0_4_;
      fVar91 = auVar53._0_4_;
      fVar92 = auVar53._0_4_;
      fVar93 = auVar53._0_4_;
      fVar108 = auVar53._0_4_;
      fVar110 = auVar53._0_4_;
      local_27b8 = uVar27;
      local_27b0 = uVar26;
      local_27a8 = ray;
      local_27a0 = context;
      do {
        do {
          do {
            if (local_2700 == (undefined1 (*) [16])&local_23a0) {
              return;
            }
            pauVar28 = local_2700 + -1;
            local_2700 = local_2700 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)(*pauVar28 + 8));
          uVar33 = *(ulong *)*local_2700;
          do {
            if ((uVar33 & 8) == 0) {
              auVar8 = vsubps_avx(*(undefined1 (*) [32])(uVar33 + 0x40 + uVar19),auVar90._0_32_);
              auVar9._4_4_ = fVar97 * auVar8._4_4_;
              auVar9._0_4_ = auVar59._0_4_ * auVar8._0_4_;
              auVar9._8_4_ = fVar98 * auVar8._8_4_;
              auVar9._12_4_ = fVar99 * auVar8._12_4_;
              auVar9._16_4_ = fVar100 * auVar8._16_4_;
              auVar9._20_4_ = fVar101 * auVar8._20_4_;
              auVar9._24_4_ = fVar102 * auVar8._24_4_;
              auVar9._28_4_ = auVar8._28_4_;
              auVar8 = vsubps_avx(*(undefined1 (*) [32])(uVar33 + 0x40 + uVar26),auVar94._0_32_);
              auVar11._4_4_ = auVar103._4_4_ * auVar8._4_4_;
              auVar11._0_4_ = auVar103._0_4_ * auVar8._0_4_;
              auVar11._8_4_ = auVar103._8_4_ * auVar8._8_4_;
              auVar11._12_4_ = auVar103._12_4_ * auVar8._12_4_;
              auVar11._16_4_ = auVar103._16_4_ * auVar8._16_4_;
              auVar11._20_4_ = auVar103._20_4_ * auVar8._20_4_;
              auVar11._24_4_ = auVar103._24_4_ * auVar8._24_4_;
              auVar11._28_4_ = auVar8._28_4_;
              auVar8 = vmaxps_avx(auVar9,auVar11);
              auVar9 = vsubps_avx(*(undefined1 (*) [32])(uVar33 + 0x40 + uVar27),auVar95._0_32_);
              auVar12._4_4_ = auVar105._4_4_ * auVar9._4_4_;
              auVar12._0_4_ = auVar105._0_4_ * auVar9._0_4_;
              auVar12._8_4_ = auVar105._8_4_ * auVar9._8_4_;
              auVar12._12_4_ = auVar105._12_4_ * auVar9._12_4_;
              auVar12._16_4_ = auVar105._16_4_ * auVar9._16_4_;
              auVar12._20_4_ = auVar105._20_4_ * auVar9._20_4_;
              auVar12._24_4_ = auVar105._24_4_ * auVar9._24_4_;
              auVar12._28_4_ = auVar9._28_4_;
              auVar9 = vmaxps_avx(auVar12,auVar84._0_32_);
              local_2680 = vmaxps_avx(auVar8,auVar9);
              auVar8 = vsubps_avx(*(undefined1 (*) [32])(uVar33 + 0x40 + local_26d8),auVar90._0_32_)
              ;
              auVar13._4_4_ = fVar85 * auVar8._4_4_;
              auVar13._0_4_ = auVar53._0_4_ * auVar8._0_4_;
              auVar13._8_4_ = fVar91 * auVar8._8_4_;
              auVar13._12_4_ = fVar92 * auVar8._12_4_;
              auVar13._16_4_ = fVar93 * auVar8._16_4_;
              auVar13._20_4_ = fVar108 * auVar8._20_4_;
              auVar13._24_4_ = fVar110 * auVar8._24_4_;
              auVar13._28_4_ = auVar8._28_4_;
              auVar8 = vsubps_avx(*(undefined1 (*) [32])(uVar33 + 0x40 + local_26e0),auVar94._0_32_)
              ;
              auVar14._4_4_ = auVar107._4_4_ * auVar8._4_4_;
              auVar14._0_4_ = auVar107._0_4_ * auVar8._0_4_;
              auVar14._8_4_ = auVar107._8_4_ * auVar8._8_4_;
              auVar14._12_4_ = auVar107._12_4_ * auVar8._12_4_;
              auVar14._16_4_ = auVar107._16_4_ * auVar8._16_4_;
              auVar14._20_4_ = auVar107._20_4_ * auVar8._20_4_;
              auVar14._24_4_ = auVar107._24_4_ * auVar8._24_4_;
              auVar14._28_4_ = auVar8._28_4_;
              auVar8 = vminps_avx(auVar13,auVar14);
              auVar9 = vsubps_avx(*(undefined1 (*) [32])(uVar33 + 0x40 + local_26e8),auVar95._0_32_)
              ;
              auVar15._4_4_ = auVar109._4_4_ * auVar9._4_4_;
              auVar15._0_4_ = auVar109._0_4_ * auVar9._0_4_;
              auVar15._8_4_ = auVar109._8_4_ * auVar9._8_4_;
              auVar15._12_4_ = auVar109._12_4_ * auVar9._12_4_;
              auVar15._16_4_ = auVar109._16_4_ * auVar9._16_4_;
              auVar15._20_4_ = auVar109._20_4_ * auVar9._20_4_;
              auVar15._24_4_ = auVar109._24_4_ * auVar9._24_4_;
              auVar15._28_4_ = auVar9._28_4_;
              auVar9 = vminps_avx(auVar15,auVar40._0_32_);
              auVar8 = vminps_avx(auVar8,auVar9);
              auVar8 = vcmpps_avx(local_2680,auVar8,2);
              uVar31 = vmovmskps_avx(auVar8);
              unaff_R14 = CONCAT44((int)(unaff_R14 >> 0x20),uVar31);
            }
            if ((uVar33 & 8) == 0) {
              if (unaff_R14 == 0) {
                iVar17 = 4;
              }
              else {
                uVar32 = uVar33 & 0xfffffffffffffff0;
                lVar20 = 0;
                for (uVar33 = unaff_R14; (uVar33 & 1) == 0;
                    uVar33 = uVar33 >> 1 | 0x8000000000000000) {
                  lVar20 = lVar20 + 1;
                }
                iVar17 = 0;
                uVar22 = unaff_R14 - 1 & unaff_R14;
                uVar33 = *(ulong *)(uVar32 + lVar20 * 8);
                if (uVar22 != 0) {
                  uVar3 = *(uint *)(local_2680 + lVar20 * 4);
                  lVar20 = 0;
                  for (uVar26 = uVar22; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000
                      ) {
                    lVar20 = lVar20 + 1;
                  }
                  uVar22 = uVar22 - 1 & uVar22;
                  uVar4 = *(ulong *)(uVar32 + lVar20 * 8);
                  uVar2 = *(uint *)(local_2680 + lVar20 * 4);
                  uVar26 = local_27b0;
                  uVar27 = local_27b8;
                  if (uVar22 == 0) {
                    if (uVar3 < uVar2) {
                      *(ulong *)*local_2700 = uVar4;
                      *(uint *)(*local_2700 + 8) = uVar2;
                      local_2700 = local_2700 + 1;
                    }
                    else {
                      *(ulong *)*local_2700 = uVar33;
                      *(uint *)(*local_2700 + 8) = uVar3;
                      local_2700 = local_2700 + 1;
                      uVar33 = uVar4;
                    }
                  }
                  else {
                    auVar82._8_8_ = 0;
                    auVar82._0_8_ = uVar33;
                    auVar82 = vpunpcklqdq_avx(auVar82,ZEXT416(uVar3));
                    auVar83._8_8_ = 0;
                    auVar83._0_8_ = uVar4;
                    auVar67 = vpunpcklqdq_avx(auVar83,ZEXT416(uVar2));
                    lVar20 = 0;
                    for (uVar33 = uVar22; (uVar33 & 1) == 0;
                        uVar33 = uVar33 >> 1 | 0x8000000000000000) {
                      lVar20 = lVar20 + 1;
                    }
                    uVar22 = uVar22 - 1 & uVar22;
                    auVar54._8_8_ = 0;
                    auVar54._0_8_ = *(ulong *)(uVar32 + lVar20 * 8);
                    auVar83 = vpunpcklqdq_avx(auVar54,ZEXT416(*(uint *)(local_2680 + lVar20 * 4)));
                    if (uVar22 == 0) {
                      auVar54 = vpcmpgtd_avx(auVar67,auVar82);
                      auVar68 = vpshufd_avx(auVar54,0xaa);
                      auVar54 = vblendvps_avx(auVar67,auVar82,auVar68);
                      auVar82 = vblendvps_avx(auVar82,auVar67,auVar68);
                      auVar67 = vpcmpgtd_avx(auVar83,auVar54);
                      auVar68 = vpshufd_avx(auVar67,0xaa);
                      auVar67 = vblendvps_avx(auVar83,auVar54,auVar68);
                      auVar83 = vblendvps_avx(auVar54,auVar83,auVar68);
                      auVar54 = vpcmpgtd_avx(auVar83,auVar82);
                      auVar68 = vpshufd_avx(auVar54,0xaa);
                      auVar54 = vblendvps_avx(auVar83,auVar82,auVar68);
                      auVar82 = vblendvps_avx(auVar82,auVar83,auVar68);
                      *local_2700 = auVar82;
                      local_2700[1] = auVar54;
                      uVar33 = auVar67._0_8_;
                      local_2700 = local_2700 + 2;
                    }
                    else {
                      lVar20 = 0;
                      for (uVar33 = uVar22; (uVar33 & 1) == 0;
                          uVar33 = uVar33 >> 1 | 0x8000000000000000) {
                        lVar20 = lVar20 + 1;
                      }
                      uVar22 = uVar22 - 1 & uVar22;
                      auVar60._8_8_ = 0;
                      auVar60._0_8_ = *(ulong *)(uVar32 + lVar20 * 8);
                      auVar54 = vpunpcklqdq_avx(auVar60,ZEXT416(*(uint *)(local_2680 + lVar20 * 4)))
                      ;
                      if (uVar22 == 0) {
                        auVar68 = vpcmpgtd_avx(auVar67,auVar82);
                        auVar69 = vpshufd_avx(auVar68,0xaa);
                        auVar68 = vblendvps_avx(auVar67,auVar82,auVar69);
                        auVar82 = vblendvps_avx(auVar82,auVar67,auVar69);
                        auVar67 = vpcmpgtd_avx(auVar54,auVar83);
                        auVar69 = vpshufd_avx(auVar67,0xaa);
                        auVar67 = vblendvps_avx(auVar54,auVar83,auVar69);
                        auVar83 = vblendvps_avx(auVar83,auVar54,auVar69);
                        auVar54 = vpcmpgtd_avx(auVar83,auVar82);
                        auVar69 = vpshufd_avx(auVar54,0xaa);
                        auVar54 = vblendvps_avx(auVar83,auVar82,auVar69);
                        auVar82 = vblendvps_avx(auVar82,auVar83,auVar69);
                        auVar83 = vpcmpgtd_avx(auVar67,auVar68);
                        auVar69 = vpshufd_avx(auVar83,0xaa);
                        auVar83 = vblendvps_avx(auVar67,auVar68,auVar69);
                        auVar67 = vblendvps_avx(auVar68,auVar67,auVar69);
                        auVar68 = vpcmpgtd_avx(auVar54,auVar67);
                        auVar69 = vpshufd_avx(auVar68,0xaa);
                        auVar68 = vblendvps_avx(auVar54,auVar67,auVar69);
                        auVar67 = vblendvps_avx(auVar67,auVar54,auVar69);
                        *local_2700 = auVar82;
                        local_2700[1] = auVar67;
                        local_2700[2] = auVar68;
                        uVar33 = auVar83._0_8_;
                        pauVar28 = local_2700 + 3;
                      }
                      else {
                        *local_2700 = auVar82;
                        local_2700[1] = auVar67;
                        local_2700[2] = auVar83;
                        local_2700[3] = auVar54;
                        lVar20 = 0x30;
                        do {
                          lVar23 = lVar20;
                          lVar20 = 0;
                          for (uVar33 = uVar22; (uVar33 & 1) == 0;
                              uVar33 = uVar33 >> 1 | 0x8000000000000000) {
                            lVar20 = lVar20 + 1;
                          }
                          auVar41._8_8_ = 0;
                          auVar41._0_8_ = *(ulong *)(uVar32 + lVar20 * 8);
                          auVar82 = vpunpcklqdq_avx(auVar41,ZEXT416(*(uint *)(local_2680 +
                                                                             lVar20 * 4)));
                          *(undefined1 (*) [16])(local_2700[1] + lVar23) = auVar82;
                          uVar22 = uVar22 - 1 & uVar22;
                          lVar20 = lVar23 + 0x10;
                        } while (uVar22 != 0);
                        pauVar28 = (undefined1 (*) [16])(local_2700[1] + lVar23);
                        if (lVar23 + 0x10 != 0) {
                          lVar20 = 0x10;
                          pauVar21 = local_2700;
                          do {
                            auVar82 = pauVar21[1];
                            uVar3 = *(uint *)(pauVar21[1] + 8);
                            pauVar21 = pauVar21 + 1;
                            lVar23 = lVar20;
                            do {
                              if (uVar3 <= *(uint *)(local_2700[-1] + lVar23 + 8)) {
                                pauVar24 = (undefined1 (*) [16])(*local_2700 + lVar23);
                                break;
                              }
                              *(undefined1 (*) [16])(*local_2700 + lVar23) =
                                   *(undefined1 (*) [16])(local_2700[-1] + lVar23);
                              lVar23 = lVar23 + -0x10;
                              pauVar24 = local_2700;
                            } while (lVar23 != 0);
                            *pauVar24 = auVar82;
                            lVar20 = lVar20 + 0x10;
                          } while (pauVar28 != pauVar21);
                        }
                        uVar33 = *(ulong *)*pauVar28;
                      }
                      auVar84 = ZEXT3264(local_25c0);
                      context = local_27a0;
                      ray = local_27a8;
                      local_2700 = pauVar28;
                      iVar17 = 0;
                    }
                  }
                }
              }
            }
            else {
              iVar17 = 6;
            }
          } while (iVar17 == 0);
        } while (iVar17 != 6);
        pRVar18 = (RayHit *)((ulong)((uint)uVar33 & 0xf) - 8);
        local_26f0 = pRVar18;
        if (pRVar18 != (RayHit *)0x0) {
          uVar33 = uVar33 & 0xfffffffffffffff0;
          pRVar29 = (RayHit *)0x0;
          local_26f8 = unaff_R14;
          do {
            lVar20 = (long)pRVar29 * 0xb0;
            local_2650 = &local_27b9;
            uVar31 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar34._4_4_ = uVar31;
            auVar34._0_4_ = uVar31;
            auVar34._8_4_ = uVar31;
            auVar34._12_4_ = uVar31;
            uVar31 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar46._4_4_ = uVar31;
            auVar46._0_4_ = uVar31;
            auVar46._8_4_ = uVar31;
            auVar46._12_4_ = uVar31;
            uVar31 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar55._4_4_ = uVar31;
            auVar55._0_4_ = uVar31;
            auVar55._8_4_ = uVar31;
            auVar55._12_4_ = uVar31;
            local_2510 = vsubps_avx(*(undefined1 (*) [16])(uVar33 + lVar20),auVar34);
            local_2520 = vsubps_avx(*(undefined1 (*) [16])(uVar33 + 0x10 + lVar20),auVar46);
            local_24d0 = vsubps_avx(*(undefined1 (*) [16])(uVar33 + 0x20 + lVar20),auVar55);
            auVar82 = vsubps_avx(*(undefined1 (*) [16])(uVar33 + 0x30 + lVar20),auVar34);
            auVar67 = vsubps_avx(*(undefined1 (*) [16])(uVar33 + 0x40 + lVar20),auVar46);
            local_2790 = vsubps_avx(*(undefined1 (*) [16])(uVar33 + 0x50 + lVar20),auVar55);
            auVar83 = vsubps_avx(*(undefined1 (*) [16])(uVar33 + 0x60 + lVar20),auVar34);
            auVar54 = vsubps_avx(*(undefined1 (*) [16])(uVar33 + 0x70 + lVar20),auVar46);
            auVar68 = vsubps_avx(*(undefined1 (*) [16])(uVar33 + 0x80 + lVar20),auVar55);
            local_24e0 = vsubps_avx(auVar83,local_2510);
            local_2500 = vsubps_avx(auVar54,local_2520);
            local_24f0 = vsubps_avx(auVar68,local_24d0);
            auVar35._0_4_ = local_2510._0_4_ + auVar83._0_4_;
            auVar35._4_4_ = local_2510._4_4_ + auVar83._4_4_;
            auVar35._8_4_ = local_2510._8_4_ + auVar83._8_4_;
            auVar35._12_4_ = local_2510._12_4_ + auVar83._12_4_;
            auVar56._0_4_ = local_2520._0_4_ + auVar54._0_4_;
            auVar56._4_4_ = local_2520._4_4_ + auVar54._4_4_;
            auVar56._8_4_ = local_2520._8_4_ + auVar54._8_4_;
            auVar56._12_4_ = local_2520._12_4_ + auVar54._12_4_;
            fVar85 = local_24d0._0_4_;
            auVar61._0_4_ = fVar85 + auVar68._0_4_;
            fVar91 = local_24d0._4_4_;
            auVar61._4_4_ = fVar91 + auVar68._4_4_;
            fVar92 = local_24d0._8_4_;
            auVar61._8_4_ = fVar92 + auVar68._8_4_;
            fVar93 = local_24d0._12_4_;
            auVar61._12_4_ = fVar93 + auVar68._12_4_;
            auVar106._0_4_ = local_24f0._0_4_ * auVar56._0_4_;
            auVar106._4_4_ = local_24f0._4_4_ * auVar56._4_4_;
            auVar106._8_4_ = local_24f0._8_4_ * auVar56._8_4_;
            auVar106._12_4_ = local_24f0._12_4_ * auVar56._12_4_;
            auVar59 = vfmsub231ps_fma(auVar106,local_2500,auVar61);
            auVar62._0_4_ = auVar61._0_4_ * local_24e0._0_4_;
            auVar62._4_4_ = auVar61._4_4_ * local_24e0._4_4_;
            auVar62._8_4_ = auVar61._8_4_ * local_24e0._8_4_;
            auVar62._12_4_ = auVar61._12_4_ * local_24e0._12_4_;
            auVar53 = vfmsub231ps_fma(auVar62,local_24f0,auVar35);
            auVar36._0_4_ = local_2500._0_4_ * auVar35._0_4_;
            auVar36._4_4_ = local_2500._4_4_ * auVar35._4_4_;
            auVar36._8_4_ = local_2500._8_4_ * auVar35._8_4_;
            auVar36._12_4_ = local_2500._12_4_ * auVar35._12_4_;
            auVar69 = vfmsub231ps_fma(auVar36,local_24e0,auVar56);
            local_2770._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar104._0_4_ = local_2770._4_4_ * auVar69._0_4_;
            auVar104._4_4_ = local_2770._4_4_ * auVar69._4_4_;
            auVar104._8_4_ = local_2770._4_4_ * auVar69._8_4_;
            auVar104._12_4_ = local_2770._4_4_ * auVar69._12_4_;
            uVar31 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
            local_2760._4_4_ = uVar31;
            local_2760._0_4_ = uVar31;
            local_2760._8_4_ = uVar31;
            local_2760._12_4_ = uVar31;
            auVar53 = vfmadd231ps_fma(auVar104,local_2760,auVar53);
            uVar31 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
            local_2780._4_4_ = uVar31;
            local_2780._0_4_ = uVar31;
            local_2780._8_4_ = uVar31;
            local_2780._12_4_ = uVar31;
            local_2680._0_16_ = vfmadd231ps_fma(auVar53,local_2780,auVar59);
            local_2540 = vsubps_avx(local_2520,auVar67);
            local_2550 = vsubps_avx(local_24d0,local_2790);
            auVar57._0_4_ = local_2520._0_4_ + auVar67._0_4_;
            auVar57._4_4_ = local_2520._4_4_ + auVar67._4_4_;
            auVar57._8_4_ = local_2520._8_4_ + auVar67._8_4_;
            auVar57._12_4_ = local_2520._12_4_ + auVar67._12_4_;
            auVar63._0_4_ = local_2790._0_4_ + fVar85;
            auVar63._4_4_ = local_2790._4_4_ + fVar91;
            auVar63._8_4_ = local_2790._8_4_ + fVar92;
            auVar63._12_4_ = local_2790._12_4_ + fVar93;
            auVar59._0_4_ = local_2550._0_4_;
            auVar75._0_4_ = auVar57._0_4_ * auVar59._0_4_;
            fVar98 = local_2550._4_4_;
            auVar75._4_4_ = auVar57._4_4_ * fVar98;
            fVar100 = local_2550._8_4_;
            auVar75._8_4_ = auVar57._8_4_ * fVar100;
            fVar102 = local_2550._12_4_;
            auVar75._12_4_ = auVar57._12_4_ * fVar102;
            auVar60 = vfmsub231ps_fma(auVar75,local_2540,auVar63);
            local_2530 = vsubps_avx(local_2510,auVar82);
            fVar97 = local_2530._0_4_;
            auVar86._0_4_ = auVar63._0_4_ * fVar97;
            fVar99 = local_2530._4_4_;
            auVar86._4_4_ = auVar63._4_4_ * fVar99;
            fVar101 = local_2530._8_4_;
            auVar86._8_4_ = auVar63._8_4_ * fVar101;
            auVar53._0_4_ = local_2530._12_4_;
            auVar86._12_4_ = auVar63._12_4_ * auVar53._0_4_;
            auVar64._0_4_ = local_2510._0_4_ + auVar82._0_4_;
            auVar64._4_4_ = local_2510._4_4_ + auVar82._4_4_;
            auVar64._8_4_ = local_2510._8_4_ + auVar82._8_4_;
            auVar64._12_4_ = local_2510._12_4_ + auVar82._12_4_;
            auVar69 = vfmsub231ps_fma(auVar86,local_2550,auVar64);
            fVar108 = local_2540._0_4_;
            auVar65._0_4_ = fVar108 * auVar64._0_4_;
            fVar110 = local_2540._4_4_;
            auVar65._4_4_ = fVar110 * auVar64._4_4_;
            fVar111 = local_2540._8_4_;
            auVar65._8_4_ = fVar111 * auVar64._8_4_;
            fVar112 = local_2540._12_4_;
            auVar65._12_4_ = fVar112 * auVar64._12_4_;
            auVar41 = vfmsub231ps_fma(auVar65,local_2530,auVar57);
            auVar66._0_4_ = local_2770._4_4_ * auVar41._0_4_;
            auVar66._4_4_ = local_2770._4_4_ * auVar41._4_4_;
            auVar66._8_4_ = local_2770._4_4_ * auVar41._8_4_;
            auVar66._12_4_ = local_2770._4_4_ * auVar41._12_4_;
            auVar69 = vfmadd231ps_fma(auVar66,local_2760,auVar69);
            local_2570 = vfmadd231ps_fma(auVar69,local_2780,auVar60);
            auVar69 = vsubps_avx(auVar82,auVar83);
            auVar76._0_4_ = auVar82._0_4_ + auVar83._0_4_;
            auVar76._4_4_ = auVar82._4_4_ + auVar83._4_4_;
            auVar76._8_4_ = auVar82._8_4_ + auVar83._8_4_;
            auVar76._12_4_ = auVar82._12_4_ + auVar83._12_4_;
            auVar83 = vsubps_avx(auVar67,auVar54);
            auVar47._0_4_ = auVar67._0_4_ + auVar54._0_4_;
            auVar47._4_4_ = auVar67._4_4_ + auVar54._4_4_;
            auVar47._8_4_ = auVar67._8_4_ + auVar54._8_4_;
            auVar47._12_4_ = auVar67._12_4_ + auVar54._12_4_;
            auVar54 = vsubps_avx(local_2790,auVar68);
            auVar42._0_4_ = local_2790._0_4_ + auVar68._0_4_;
            auVar42._4_4_ = local_2790._4_4_ + auVar68._4_4_;
            auVar42._8_4_ = local_2790._8_4_ + auVar68._8_4_;
            auVar42._12_4_ = local_2790._12_4_ + auVar68._12_4_;
            auVar70._0_4_ = auVar54._0_4_ * auVar47._0_4_;
            auVar70._4_4_ = auVar54._4_4_ * auVar47._4_4_;
            auVar70._8_4_ = auVar54._8_4_ * auVar47._8_4_;
            auVar70._12_4_ = auVar54._12_4_ * auVar47._12_4_;
            auVar67 = vfmsub231ps_fma(auVar70,auVar83,auVar42);
            auVar43._0_4_ = auVar42._0_4_ * auVar69._0_4_;
            auVar43._4_4_ = auVar42._4_4_ * auVar69._4_4_;
            auVar43._8_4_ = auVar42._8_4_ * auVar69._8_4_;
            auVar43._12_4_ = auVar42._12_4_ * auVar69._12_4_;
            auVar82 = vfmsub231ps_fma(auVar43,auVar54,auVar76);
            auVar77._0_4_ = auVar83._0_4_ * auVar76._0_4_;
            auVar77._4_4_ = auVar83._4_4_ * auVar76._4_4_;
            auVar77._8_4_ = auVar83._8_4_ * auVar76._8_4_;
            auVar77._12_4_ = auVar83._12_4_ * auVar76._12_4_;
            auVar68 = vfmsub231ps_fma(auVar77,auVar69,auVar47);
            local_2770._0_4_ = local_2770._4_4_;
            fStack_2768 = local_2770._4_4_;
            fStack_2764 = local_2770._4_4_;
            auVar48._0_4_ = local_2770._4_4_ * auVar68._0_4_;
            auVar48._4_4_ = local_2770._4_4_ * auVar68._4_4_;
            auVar48._8_4_ = local_2770._4_4_ * auVar68._8_4_;
            auVar48._12_4_ = local_2770._4_4_ * auVar68._12_4_;
            auVar82 = vfmadd231ps_fma(auVar48,local_2760,auVar82);
            auVar68 = vfmadd231ps_fma(auVar82,local_2780,auVar67);
            local_2590._0_4_ = auVar68._0_4_ + local_2680._0_4_ + local_2570._0_4_;
            local_2590._4_4_ = auVar68._4_4_ + local_2680._4_4_ + local_2570._4_4_;
            local_2590._8_4_ = auVar68._8_4_ + local_2680._8_4_ + local_2570._8_4_;
            local_2590._12_4_ = auVar68._12_4_ + local_2680._12_4_ + local_2570._12_4_;
            auVar82 = vminps_avx(local_2680._0_16_,local_2570);
            auVar82 = vminps_avx(auVar82,auVar68);
            local_2560 = vandps_avx(local_2590,local_2690);
            auVar71._0_4_ = local_2560._0_4_ * 1.1920929e-07;
            auVar71._4_4_ = local_2560._4_4_ * 1.1920929e-07;
            auVar71._8_4_ = local_2560._8_4_ * 1.1920929e-07;
            auVar71._12_4_ = local_2560._12_4_ * 1.1920929e-07;
            uVar19 = CONCAT44(auVar71._4_4_,auVar71._0_4_);
            auVar78._0_8_ = uVar19 ^ 0x8000000080000000;
            auVar78._8_4_ = -auVar71._8_4_;
            auVar78._12_4_ = -auVar71._12_4_;
            auVar82 = vcmpps_avx(auVar82,auVar78,5);
            auVar67 = vmaxps_avx(local_2680._0_16_,local_2570);
            auVar67 = vmaxps_avx(auVar67,auVar68);
            auVar67 = vcmpps_avx(auVar67,auVar71,2);
            local_2580 = vorps_avx(auVar82,auVar67);
            auVar10._8_8_ = uStack_2698;
            auVar10._0_8_ = local_26a0;
            auVar10 = auVar10 & local_2580;
            if ((((auVar10 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar10 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar10 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar10[0xf] < '\0') {
              auVar44._0_4_ = fVar108 * local_24f0._0_4_;
              auVar44._4_4_ = fVar110 * local_24f0._4_4_;
              auVar44._8_4_ = fVar111 * local_24f0._8_4_;
              auVar44._12_4_ = fVar112 * local_24f0._12_4_;
              auVar72._0_4_ = fVar97 * local_2500._0_4_;
              auVar72._4_4_ = fVar99 * local_2500._4_4_;
              auVar72._8_4_ = fVar101 * local_2500._8_4_;
              auVar72._12_4_ = auVar53._0_4_ * local_2500._12_4_;
              auVar68 = vfmsub213ps_fma(local_2500,local_2550,auVar44);
              auVar49._0_4_ = auVar59._0_4_ * auVar83._0_4_;
              auVar49._4_4_ = fVar98 * auVar83._4_4_;
              auVar49._8_4_ = fVar100 * auVar83._8_4_;
              auVar49._12_4_ = fVar102 * auVar83._12_4_;
              auVar79._0_4_ = auVar54._0_4_ * fVar97;
              auVar79._4_4_ = auVar54._4_4_ * fVar99;
              auVar79._8_4_ = auVar54._8_4_ * fVar101;
              auVar79._12_4_ = auVar54._12_4_ * auVar53._0_4_;
              auVar54 = vfmsub213ps_fma(auVar54,local_2540,auVar49);
              local_2790 = local_2680._0_16_;
              auVar82 = vandps_avx(local_2690,auVar44);
              auVar67 = vandps_avx(local_2690,auVar49);
              auVar82 = vcmpps_avx(auVar82,auVar67,1);
              local_2600 = vblendvps_avx(auVar54,auVar68,auVar82);
              auVar87._0_4_ = fVar108 * auVar69._0_4_;
              auVar87._4_4_ = fVar110 * auVar69._4_4_;
              auVar87._8_4_ = fVar111 * auVar69._8_4_;
              auVar87._12_4_ = fVar112 * auVar69._12_4_;
              auVar54 = vfmsub213ps_fma(auVar69,local_2550,auVar79);
              auVar50._0_4_ = auVar59._0_4_ * local_24e0._0_4_;
              auVar50._4_4_ = fVar98 * local_24e0._4_4_;
              auVar50._8_4_ = fVar100 * local_24e0._8_4_;
              auVar50._12_4_ = fVar102 * local_24e0._12_4_;
              auVar68 = vfmsub213ps_fma(local_24f0,local_2530,auVar50);
              auVar82 = vandps_avx(local_2690,auVar50);
              auVar67 = vandps_avx(local_2690,auVar79);
              auVar82 = vcmpps_avx(auVar82,auVar67,1);
              local_25f0 = vblendvps_avx(auVar54,auVar68,auVar82);
              auVar54 = vfmsub213ps_fma(local_24e0,local_2540,auVar72);
              auVar83 = vfmsub213ps_fma(auVar83,local_2530,auVar87);
              auVar82 = vandps_avx(local_2690,auVar72);
              auVar67 = vandps_avx(local_2690,auVar87);
              auVar82 = vcmpps_avx(auVar82,auVar67,1);
              local_25e0[0] = vblendvps_avx(auVar83,auVar54,auVar82);
              auVar73._0_4_ = local_25e0[0]._0_4_ * local_2770._4_4_;
              auVar73._4_4_ = local_25e0[0]._4_4_ * local_2770._4_4_;
              auVar73._8_4_ = local_25e0[0]._8_4_ * local_2770._4_4_;
              auVar73._12_4_ = local_25e0[0]._12_4_ * local_2770._4_4_;
              auVar82 = vfmadd213ps_fma(local_2760,local_25f0,auVar73);
              auVar82 = vfmadd213ps_fma(local_2780,local_2600,auVar82);
              auVar74._0_4_ = auVar82._0_4_ + auVar82._0_4_;
              auVar74._4_4_ = auVar82._4_4_ + auVar82._4_4_;
              auVar74._8_4_ = auVar82._8_4_ + auVar82._8_4_;
              auVar74._12_4_ = auVar82._12_4_ + auVar82._12_4_;
              auVar80._0_4_ = local_25e0[0]._0_4_ * fVar85;
              auVar80._4_4_ = local_25e0[0]._4_4_ * fVar91;
              auVar80._8_4_ = local_25e0[0]._8_4_ * fVar92;
              auVar80._12_4_ = local_25e0[0]._12_4_ * fVar93;
              auVar82 = vfmadd213ps_fma(local_2520,local_25f0,auVar80);
              auVar67 = vfmadd213ps_fma(local_2510,local_2600,auVar82);
              auVar82 = vrcpps_avx(auVar74);
              auVar96._8_4_ = 0x3f800000;
              auVar96._0_8_ = &DAT_3f8000003f800000;
              auVar96._12_4_ = 0x3f800000;
              auVar83 = vfnmadd213ps_fma(auVar82,auVar74,auVar96);
              auVar82 = vfmadd132ps_fma(auVar83,auVar82,auVar82);
              local_2610._0_4_ = auVar82._0_4_ * (auVar67._0_4_ + auVar67._0_4_);
              local_2610._4_4_ = auVar82._4_4_ * (auVar67._4_4_ + auVar67._4_4_);
              local_2610._8_4_ = auVar82._8_4_ * (auVar67._8_4_ + auVar67._8_4_);
              local_2610._12_4_ = auVar82._12_4_ * (auVar67._12_4_ + auVar67._12_4_);
              uVar31 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar81._4_4_ = uVar31;
              auVar81._0_4_ = uVar31;
              auVar81._8_4_ = uVar31;
              auVar81._12_4_ = uVar31;
              auVar82 = vcmpps_avx(auVar81,local_2610,2);
              auVar59._0_4_ = (ray->super_RayK<1>).tfar;
              auVar88._4_4_ = auVar59._0_4_;
              auVar88._0_4_ = auVar59._0_4_;
              auVar88._8_4_ = auVar59._0_4_;
              auVar88._12_4_ = auVar59._0_4_;
              auVar67 = vcmpps_avx(local_2610,auVar88,2);
              auVar82 = vandps_avx(auVar67,auVar82);
              uVar19 = CONCAT44(auVar74._4_4_,auVar74._0_4_);
              auVar89._0_8_ = uVar19 ^ 0x8000000080000000;
              auVar89._8_4_ = -auVar74._8_4_;
              auVar89._12_4_ = -auVar74._12_4_;
              auVar67 = vcmpps_avx(auVar74,auVar89,4);
              auVar82 = vandps_avx(auVar67,auVar82);
              auVar16._8_8_ = uStack_2698;
              auVar16._0_8_ = local_26a0;
              auVar67 = vandps_avx(local_2580,auVar16);
              auVar82 = vpslld_avx(auVar82,0x1f);
              auVar83 = vpsrad_avx(auVar82,0x1f);
              auVar82 = auVar67 & auVar83;
              if ((((auVar82 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar82 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar82 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar82[0xf] < '\0') {
                auVar82 = vandps_avx(auVar83,auVar67);
                local_2680._16_16_ = local_2570;
                local_2660 = local_2590;
                local_2640 = auVar82;
                pSVar25 = context->scene;
                local_2750 = auVar82;
                auVar67 = vrcpps_avx(local_2590);
                auVar58._8_4_ = 0x3f800000;
                auVar58._0_8_ = &DAT_3f8000003f800000;
                auVar58._12_4_ = 0x3f800000;
                auVar83 = vfnmadd213ps_fma(local_2590,auVar67,auVar58);
                auVar83 = vfmadd132ps_fma(auVar83,auVar67,auVar67);
                auVar51._8_4_ = 0x219392ef;
                auVar51._0_8_ = 0x219392ef219392ef;
                auVar51._12_4_ = 0x219392ef;
                auVar67 = vcmpps_avx(local_2560,auVar51,5);
                auVar67 = vandps_avx(auVar83,auVar67);
                auVar37._0_4_ = local_2680._0_4_ * auVar67._0_4_;
                auVar37._4_4_ = local_2680._4_4_ * auVar67._4_4_;
                auVar37._8_4_ = local_2680._8_4_ * auVar67._8_4_;
                auVar37._12_4_ = local_2680._12_4_ * auVar67._12_4_;
                local_2630 = vminps_avx(auVar37,auVar58);
                auVar38._0_4_ = auVar67._0_4_ * local_2570._0_4_;
                auVar38._4_4_ = auVar67._4_4_ * local_2570._4_4_;
                auVar38._8_4_ = auVar67._8_4_ * local_2570._8_4_;
                auVar38._12_4_ = auVar67._12_4_ * local_2570._12_4_;
                local_2620 = vminps_avx(auVar38,auVar58);
                auVar39._8_4_ = 0x7f800000;
                auVar39._0_8_ = 0x7f8000007f800000;
                auVar39._12_4_ = 0x7f800000;
                auVar67 = vblendvps_avx(auVar39,local_2610,auVar82);
                auVar83 = vshufps_avx(auVar67,auVar67,0xb1);
                auVar83 = vminps_avx(auVar83,auVar67);
                auVar54 = vshufpd_avx(auVar83,auVar83,1);
                auVar83 = vminps_avx(auVar54,auVar83);
                auVar67 = vcmpps_avx(auVar67,auVar83,0);
                auVar83 = auVar82 & auVar67;
                local_2760 = local_2610;
                if ((((auVar83 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar83 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar83 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar83[0xf] < '\0') {
                  auVar82 = vandps_avx(auVar67,auVar82);
                }
                lVar20 = lVar20 + uVar33;
                uVar31 = vmovmskps_avx(auVar82);
                pRVar30 = (RayHit *)0x0;
                for (uVar19 = CONCAT44((int)((ulong)pRVar18 >> 0x20),uVar31); (uVar19 & 1) == 0;
                    uVar19 = uVar19 >> 1 | 0x8000000000000000) {
                  pRVar30 = (RayHit *)((long)(pRVar30->super_RayK<1>).org.field_0.m128 + 1);
                }
                do {
                  uVar3 = *(uint *)(lVar20 + 0x90 + (long)pRVar30 * 4);
                  pRVar18 = (RayHit *)(ulong)uVar3;
                  pGVar5 = (pSVar25->geometries).items[(long)pRVar18].ptr;
                  if ((pGVar5->mask & (ray->super_RayK<1>).mask) == 0) {
                    *(undefined4 *)(local_2750 + (long)pRVar30 * 4) = 0;
                  }
                  else {
                    pRVar6 = context->args;
                    if ((pRVar6->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      auVar59._0_4_ = *(float *)(local_2630 + (long)pRVar30 * 4);
                      fVar97 = *(float *)(local_2620 + (long)pRVar30 * 4);
                      (ray->super_RayK<1>).tfar = *(float *)(local_2610 + (long)pRVar30 * 4);
                      (ray->Ng).field_0.field_0.x = *(float *)(local_2600 + (long)pRVar30 * 4);
                      (ray->Ng).field_0.field_0.y = *(float *)(local_25f0 + (long)pRVar30 * 4);
                      (ray->Ng).field_0.field_0.z = *(float *)(local_25e0[0] + (long)pRVar30 * 4);
                      ray->u = auVar59._0_4_;
                      ray->v = fVar97;
                      ray->primID = *(uint *)(lVar20 + 0xa0 + (long)pRVar30 * 4);
                      ray->geomID = uVar3;
                      pRVar7 = context->user;
                      ray->instID[0] = pRVar7->instID[0];
                      pRVar18 = (RayHit *)0x0;
                      ray->instPrimID[0] = pRVar7->instPrimID[0];
                      unaff_R14 = local_26f8;
                      break;
                    }
                    local_2770 = pSVar25;
                    local_2738.context = context->user;
                    local_26d0 = *(float *)(local_2600 + (long)pRVar30 * 4);
                    local_26cc = *(undefined4 *)(local_25f0 + (long)pRVar30 * 4);
                    local_26c8 = *(undefined4 *)(local_25e0[0] + (long)pRVar30 * 4);
                    local_26c4 = *(undefined4 *)(local_2630 + (long)pRVar30 * 4);
                    local_26c0 = *(undefined4 *)(local_2620 + (long)pRVar30 * 4);
                    local_26bc = *(undefined4 *)(lVar20 + 0xa0 + (long)pRVar30 * 4);
                    local_26b8 = uVar3;
                    local_26b4 = (local_2738.context)->instID[0];
                    local_26b0 = (local_2738.context)->instPrimID[0];
                    local_2780._0_4_ = (ray->super_RayK<1>).tfar;
                    (ray->super_RayK<1>).tfar = *(float *)(local_2610 + (long)pRVar30 * 4);
                    local_2794 = (undefined1  [4])0xffffffff;
                    local_2738.valid = (int *)local_2794;
                    local_2738.geometryUserPtr = pGVar5->userPtr;
                    local_2738.ray = (RTCRayN *)ray;
                    local_2738.hit = (RTCHitN *)&local_26d0;
                    local_2738.N = 1;
                    if (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01a59733:
                      if (pRVar6->filter != (RTCFilterFunctionN)0x0) {
                        if (((pRVar6->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((pGVar5->field_8).field_0x2 & 0x40) != 0)) {
                          (*pRVar6->filter)(&local_2738);
                          context = local_27a0;
                          ray = local_27a8;
                          uVar26 = local_27b0;
                          uVar27 = local_27b8;
                        }
                        if ((((RayK<1> *)local_2738.valid)->org).field_0.m128[0] == 0.0)
                        goto LAB_01a59848;
                      }
                      (((Vec3f *)((long)local_2738.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_2738.hit;
                      (((Vec3f *)((long)local_2738.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_2738.hit + 4);
                      (((Vec3f *)((long)local_2738.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_2738.hit + 8);
                      *(float *)((long)local_2738.ray + 0x3c) = *(float *)(local_2738.hit + 0xc);
                      *(float *)((long)local_2738.ray + 0x40) = *(float *)(local_2738.hit + 0x10);
                      *(float *)((long)local_2738.ray + 0x44) = *(float *)(local_2738.hit + 0x14);
                      *(float *)((long)local_2738.ray + 0x48) = *(float *)(local_2738.hit + 0x18);
                      *(float *)((long)local_2738.ray + 0x4c) = *(float *)(local_2738.hit + 0x1c);
                      *(float *)((long)local_2738.ray + 0x50) = *(float *)(local_2738.hit + 0x20);
                      pRVar18 = (RayHit *)local_2738.ray;
                    }
                    else {
                      local_2790._0_8_ = pRVar29;
                      (*pGVar5->intersectionFilterN)(&local_2738);
                      context = local_27a0;
                      ray = local_27a8;
                      uVar26 = local_27b0;
                      uVar27 = local_27b8;
                      pRVar29 = (RayHit *)local_2790._0_8_;
                      if ((((RayK<1> *)local_2738.valid)->org).field_0.m128[0] != 0.0)
                      goto LAB_01a59733;
LAB_01a59848:
                      (ray->super_RayK<1>).tfar = (float)local_2780._0_4_;
                      pRVar18 = (RayHit *)local_2738.valid;
                    }
                    *(undefined4 *)(local_2750 + (long)pRVar30 * 4) = 0;
                    auVar59._0_4_ = (ray->super_RayK<1>).tfar;
                    auVar45._4_4_ = auVar59._0_4_;
                    auVar45._0_4_ = auVar59._0_4_;
                    auVar45._8_4_ = auVar59._0_4_;
                    auVar45._12_4_ = auVar59._0_4_;
                    auVar82 = vcmpps_avx(local_2760,auVar45,2);
                    local_2750 = vandps_avx(auVar82,local_2750);
                    pSVar25 = local_2770;
                  }
                  unaff_R14 = local_26f8;
                  if ((((local_2750 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (local_2750 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (local_2750 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < local_2750[0xf]) break;
                  BVHNIntersector1<8,1,true,embree::avx2::ArrayIntersector1<embree::avx2::TriangleMvIntersector1Pluecker<4,true>>>
                  ::intersect(&local_2738);
                  context = local_27a0;
                  ray = local_27a8;
                  uVar26 = local_27b0;
                  uVar27 = local_27b8;
                  pRVar30 = (RayHit *)local_2738.valid;
                } while( true );
              }
            }
            pRVar29 = (RayHit *)((long)&(pRVar29->super_RayK<1>).org.field_0 + 1);
          } while (pRVar29 != local_26f0);
        }
        auVar59._0_4_ = (ray->super_RayK<1>).tfar;
        auVar40 = ZEXT3264(CONCAT428(auVar59._0_4_,
                                     CONCAT424(auVar59._0_4_,
                                               CONCAT420(auVar59._0_4_,
                                                         CONCAT416(auVar59._0_4_,
                                                                   CONCAT412(auVar59._0_4_,
                                                                             CONCAT48(auVar59._0_4_,
                                                                                      CONCAT44(
                                                  auVar59._0_4_,auVar59._0_4_))))))));
        auVar90 = ZEXT3264(local_23c0);
        auVar94 = ZEXT3264(local_23e0);
        auVar95 = ZEXT3264(local_2400);
        auVar103 = ZEXT3264(local_2440);
        auVar105 = ZEXT3264(local_2460);
        auVar107 = ZEXT3264(local_24a0);
        auVar109 = ZEXT3264(local_24c0);
        auVar84 = ZEXT3264(local_25c0);
        uVar19 = local_2708;
        auVar59._0_4_ = local_2420;
        fVar97 = fStack_241c;
        fVar98 = fStack_2418;
        fVar99 = fStack_2414;
        fVar100 = fStack_2410;
        fVar101 = fStack_240c;
        fVar102 = fStack_2408;
        auVar53._0_4_ = local_2480;
        fVar85 = fStack_247c;
        fVar91 = fStack_2478;
        fVar92 = fStack_2474;
        fVar93 = fStack_2470;
        fVar108 = fStack_246c;
        fVar110 = fStack_2468;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }